

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O0

int __thiscall
ncnn::CopyTo::forward
          (CopyTo *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  reference pvVar2;
  int __flags;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  void *in_R8;
  bool bVar3;
  Mat m_3;
  Mat roim_1;
  int z;
  int q_1;
  Mat m;
  Mat roim;
  int q;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *top_blob;
  Mat *src_blob;
  Mat *self_blob;
  Mat *m_4;
  Mat *m_1;
  Mat *m_5;
  Mat *m_2;
  int *in_stack_fffffffffffff5e8;
  void **ppvVar4;
  int *in_stack_fffffffffffff5f0;
  int in_stack_fffffffffffff5f8;
  int in_stack_fffffffffffff5fc;
  Mat *in_stack_fffffffffffff600;
  Mat *self;
  Mat *in_stack_fffffffffffff608;
  Mat *src;
  CopyTo *in_stack_fffffffffffff610;
  Mat local_8c8;
  void *local_880;
  int *local_878;
  size_t local_870;
  int local_868;
  Allocator *local_860;
  undefined4 local_858;
  int local_854;
  int local_850;
  undefined4 local_84c;
  undefined4 local_848;
  long local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined8 local_828;
  undefined4 local_820;
  Allocator *local_818;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  undefined4 local_800;
  undefined8 local_7f8;
  void *local_7f0;
  int *local_7e8;
  size_t local_7e0;
  int local_7d8;
  Allocator *local_7d0;
  undefined4 local_7c8;
  int local_7c4;
  int local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  long local_7b0;
  int local_7a8;
  int local_7a4;
  void *local_7a0;
  int *local_798;
  ulong local_790;
  int local_788;
  Allocator *local_780;
  int local_778;
  int local_774;
  int local_770;
  undefined4 local_76c;
  int local_768;
  ulong local_760;
  void *local_758;
  int *local_750;
  ulong local_748;
  int local_740;
  Allocator *local_738;
  int local_730;
  int local_72c;
  int local_728;
  undefined4 local_724;
  int local_720;
  ulong local_718;
  int local_70c;
  void *local_708;
  int *local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  long *local_6e8;
  undefined4 local_6e0;
  int local_6dc;
  int local_6d8;
  int local_6d4;
  int local_6d0;
  ulong local_6c8;
  int local_6bc;
  int local_6b8;
  Mat local_6a0;
  size_t local_658;
  int local_64c;
  int local_648;
  int local_644;
  int local_640;
  int local_63c;
  reference local_638;
  const_reference local_630;
  const_reference local_628;
  long local_620;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_618;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_610;
  int local_5fc;
  Mat *local_5f8;
  void **local_5e8;
  void **local_5d8;
  void **local_5c8;
  undefined8 *local_5b8;
  Mat *local_5a8;
  void **local_598;
  void **local_588;
  int local_578;
  undefined4 local_574;
  reference local_570;
  reference local_568;
  reference local_560;
  int local_558;
  undefined4 local_554;
  const_reference local_550;
  reference local_548;
  reference local_538;
  const_reference local_530;
  void **local_528;
  void **local_520;
  undefined1 local_515;
  int local_514;
  const_reference local_510;
  undefined8 *local_508;
  undefined1 local_4f5;
  int local_4f4;
  const_reference local_4f0;
  void **local_4e8;
  undefined1 local_4d5;
  int local_4d4;
  reference local_4d0;
  Mat *local_4c8;
  undefined1 local_4b5;
  int local_4b4;
  reference local_4b0;
  void **local_4a8;
  int local_494;
  undefined8 *local_490;
  void **local_488;
  int local_47c;
  Mat *local_478;
  void **local_470;
  int local_428;
  undefined4 local_424;
  reference local_420;
  int local_418;
  undefined4 local_414;
  reference local_410;
  int local_3f8;
  undefined4 local_3f4;
  void **local_3f0;
  int local_3d8;
  undefined4 local_3d4;
  void **local_3d0;
  Mat *local_3b0;
  undefined8 *local_390;
  int local_378;
  undefined4 local_374;
  void **local_370;
  int local_358;
  undefined4 local_354;
  void **local_350;
  int local_338;
  undefined4 local_334;
  void **local_330;
  int local_318;
  undefined4 local_314;
  Mat *local_310;
  void *local_2f8;
  void *local_2e8;
  void *local_2d8;
  void *local_2a8;
  void *local_298;
  void *local_288;
  void *local_280;
  reference local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  int local_234;
  void **local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  int local_210;
  int local_20c;
  void **local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  void **local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  void **local_1a8;
  undefined4 local_19c;
  long local_198;
  undefined4 local_18c;
  long local_188;
  Allocator *local_180;
  int local_174;
  ulong local_170;
  void *local_168;
  int local_15c;
  int local_158;
  int local_154;
  void **local_150;
  undefined4 local_144;
  long local_140;
  Allocator *local_138;
  int local_12c;
  size_t local_128;
  void *local_120;
  int local_114;
  int local_110;
  int local_10c;
  Mat *local_108;
  undefined4 local_fc;
  long local_f8;
  Allocator *local_f0;
  int local_e4;
  ulong local_e0;
  void *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  void **local_c0;
  undefined4 local_b4;
  long local_b0;
  Allocator *local_a8;
  int local_9c;
  size_t local_98;
  void *local_90;
  int local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  void **local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  void *local_18;
  int local_10;
  int local_c;
  void **local_8;
  
  local_620 = in_RCX;
  local_618 = in_RDX;
  local_610 = in_RSI;
  local_628 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  __flags = (int)in_RCX;
  local_630 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_610,1);
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_618,0);
  local_63c = local_628->w;
  local_640 = local_628->h;
  local_644 = local_628->d;
  local_648 = local_628->c;
  local_64c = local_628->dims;
  local_658 = local_628->elemsize;
  local_638 = pvVar2;
  if ((((local_630->dims == local_64c) && (local_630->w == local_63c)) &&
      (local_630->h == local_640)) && ((local_630->d == local_644 && (local_630->c == local_648))))
  {
    local_550 = local_630;
    if (pvVar2 != local_630) {
      if (local_630->refcount != (int *)0x0) {
        piVar1 = local_630->refcount;
        local_554 = 1;
        LOCK();
        local_558 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      if (pvVar2->refcount != (int *)0x0) {
        piVar1 = pvVar2->refcount;
        local_424 = 0xffffffff;
        LOCK();
        local_428 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_428 == 1) {
          local_548 = pvVar2;
          local_420 = pvVar2;
          if (pvVar2->allocator == (Allocator *)0x0) {
            local_280 = pvVar2->data;
            if (local_280 != (void *)0x0) {
              free(local_280);
            }
          }
          else {
            (*pvVar2->allocator->_vptr_Allocator[3])(pvVar2->allocator,pvVar2->data);
          }
        }
      }
      pvVar2->data = (void *)0x0;
      pvVar2->elemsize = 0;
      pvVar2->elempack = 0;
      pvVar2->dims = 0;
      pvVar2->w = 0;
      pvVar2->h = 0;
      pvVar2->d = 0;
      pvVar2->c = 0;
      pvVar2->cstep = 0;
      pvVar2->refcount = (int *)0x0;
      pvVar2->data = local_550->data;
      pvVar2->refcount = local_550->refcount;
      pvVar2->elemsize = local_550->elemsize;
      pvVar2->elempack = local_550->elempack;
      pvVar2->allocator = local_550->allocator;
      pvVar2->dims = local_550->dims;
      pvVar2->w = local_550->w;
      pvVar2->h = local_550->h;
      pvVar2->d = local_550->d;
      pvVar2->c = local_550->c;
      pvVar2->cstep = local_550->cstep;
    }
    local_5fc = 0;
  }
  else {
    Mat::clone(&local_6a0,(__fn *)local_628,*(void **)(local_620 + 8),__flags,in_R8);
    pvVar2 = local_638;
    local_568 = local_638;
    local_570 = &local_6a0;
    if (local_638 != local_570) {
      if (local_6a0.refcount != (int *)0x0) {
        local_574 = 1;
        LOCK();
        local_578 = *local_6a0.refcount;
        *local_6a0.refcount = *local_6a0.refcount + 1;
        UNLOCK();
      }
      local_410 = local_638;
      if (local_638->refcount != (int *)0x0) {
        piVar1 = local_638->refcount;
        local_414 = 0xffffffff;
        LOCK();
        local_418 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_418 == 1) {
          if (local_638->allocator == (Allocator *)0x0) {
            local_288 = local_638->data;
            if (local_288 != (void *)0x0) {
              free(local_288);
            }
          }
          else {
            (*local_638->allocator->_vptr_Allocator[3])(local_638->allocator,local_638->data);
          }
        }
      }
      pvVar2->data = (void *)0x0;
      pvVar2->elemsize = 0;
      pvVar2->elempack = 0;
      pvVar2->dims = 0;
      pvVar2->w = 0;
      pvVar2->h = 0;
      pvVar2->d = 0;
      pvVar2->c = 0;
      pvVar2->cstep = 0;
      pvVar2->refcount = (int *)0x0;
      pvVar2->data = local_570->data;
      pvVar2->refcount = local_570->refcount;
      pvVar2->elemsize = local_570->elemsize;
      pvVar2->elempack = local_570->elempack;
      pvVar2->allocator = local_570->allocator;
      pvVar2->dims = local_570->dims;
      pvVar2->w = local_570->w;
      pvVar2->h = local_570->h;
      pvVar2->d = local_570->d;
      pvVar2->c = local_570->c;
      pvVar2->cstep = local_570->cstep;
    }
    local_560 = pvVar2;
    local_5f8 = &local_6a0;
    local_310 = local_5f8;
    if (local_6a0.refcount != (int *)0x0) {
      local_314 = 0xffffffff;
      LOCK();
      local_318 = *local_6a0.refcount;
      *local_6a0.refcount = *local_6a0.refcount + -1;
      UNLOCK();
      if (local_318 == 1) {
        if (local_6a0.allocator == (Allocator *)0x0) {
          if (local_6a0.data != (void *)0x0) {
            free(local_6a0.data);
          }
        }
        else {
          (*(local_6a0.allocator)->_vptr_Allocator[3])(local_6a0.allocator,local_6a0.data);
        }
      }
    }
    local_6a0.data = (void *)0x0;
    local_6a0.elemsize = 0;
    local_6a0.elempack = 0;
    local_6a0.dims = 0;
    local_6a0.w = 0;
    local_6a0.h = 0;
    local_6a0.d = 0;
    local_6a0.c = 0;
    local_6a0.cstep = 0;
    local_6a0.refcount = (int *)0x0;
    local_538 = local_638;
    bVar3 = true;
    if (local_638->data != (void *)0x0) {
      local_258 = local_638;
      bVar3 = local_638->cstep * (long)local_638->c == 0;
    }
    if (bVar3) {
      local_5fc = -100;
    }
    else {
      local_528 = &local_708;
      local_530 = local_628;
      if (local_628->dims == 1) {
        local_234 = local_628->w * local_628->elempack;
        local_230 = &local_708;
        local_240 = 0;
        local_248 = 4;
        local_250 = 0;
        local_6f8 = 4;
        local_6f0 = 1;
        local_6e0 = 1;
        local_6d8 = 1;
        local_6d4 = 1;
        local_6d0 = 1;
        local_6c8 = (ulong)local_234;
        local_6dc = local_234;
      }
      else if (local_628->dims == 2) {
        local_20c = local_628->w;
        local_210 = local_628->h * local_628->elempack;
        local_208 = &local_708;
        local_218 = 0;
        local_220 = 4;
        local_228 = 0;
        local_6f8 = 4;
        local_6f0 = 1;
        local_6e0 = 2;
        local_6d4 = 1;
        local_6d0 = 1;
        local_6c8 = (long)local_20c * (long)local_210;
        local_6dc = local_20c;
        local_6d8 = local_210;
      }
      else if (local_628->dims == 3) {
        local_1dc = local_628->w;
        local_1e0 = local_628->h;
        local_1e4 = local_628->c * local_628->elempack;
        local_1d8 = &local_708;
        local_1f0 = 0;
        local_1f8 = 4;
        local_200 = 0;
        local_6f8 = 4;
        local_6f0 = 1;
        local_6e0 = 3;
        local_6d4 = 1;
        local_188 = (long)local_1dc * (long)local_1e0 * 4;
        local_18c = 0x10;
        local_6c8 = (local_188 + 0xfU & 0xfffffffffffffff0) / 4;
        local_6dc = local_1dc;
        local_6d8 = local_1e0;
        local_6d0 = local_1e4;
      }
      else if (local_628->dims == 4) {
        local_1ac = local_628->w;
        local_1b0 = local_628->h;
        local_1b4 = local_628->d;
        local_1b8 = local_628->c * local_628->elempack;
        local_1a8 = &local_708;
        local_1c0 = 0;
        local_1c8 = 4;
        local_1d0 = 0;
        local_6f8 = 4;
        local_6f0 = 1;
        local_6e0 = 4;
        local_198 = (long)local_1ac * (long)local_1b0 * (long)local_1b4 * 4;
        local_19c = 0x10;
        local_6c8 = (local_198 + 0xfU & 0xfffffffffffffff0) / 4;
        local_6dc = local_1ac;
        local_6d8 = local_1b0;
        local_6d4 = local_1b4;
        local_6d0 = local_1b8;
      }
      else {
        local_520 = &local_708;
        local_6f8 = 0;
        local_6f0 = 0;
        local_6e0 = 0;
        local_6dc = 0;
        local_6d8 = 0;
        local_6d4 = 0;
        local_6d0 = 0;
        local_6c8 = 0;
      }
      local_6e8 = (long *)0x0;
      local_700 = (int *)0x0;
      local_708 = (void *)0x0;
      resolve_copyto_offset
                (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
                 (int *)in_stack_fffffffffffff600,
                 (int *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                 in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
      local_5e8 = &local_708;
      local_330 = local_5e8;
      if (local_700 != (int *)0x0) {
        local_334 = 0xffffffff;
        LOCK();
        local_338 = *local_700;
        *local_700 = *local_700 + -1;
        UNLOCK();
        if (local_338 == 1) {
          if (local_6e8 == (long *)0x0) {
            local_2f8 = local_708;
            if (local_708 != (void *)0x0) {
              free(local_708);
            }
          }
          else {
            (**(code **)(*local_6e8 + 0x18))(local_6e8,local_708);
          }
        }
      }
      local_708 = (void *)0x0;
      local_6f8 = 0;
      local_6f0 = 0;
      local_6e0 = 0;
      local_6dc = 0;
      local_6d8 = 0;
      local_6d4 = 0;
      local_6d0 = 0;
      local_6c8 = 0;
      local_700 = (int *)0x0;
      if (local_64c == 1) {
        if (local_658 == 1) {
          copy_to_image<signed_char>
                    (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,
                     in_stack_fffffffffffff5f8);
        }
        if (local_658 == 2) {
          copy_to_image<unsigned_short>
                    (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,
                     in_stack_fffffffffffff5f8);
        }
        if (local_658 == 4) {
          copy_to_image<float>
                    (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,
                     in_stack_fffffffffffff5f8);
        }
      }
      if (local_64c == 2) {
        if (local_658 == 1) {
          copy_to_image<signed_char>
                    (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,
                     in_stack_fffffffffffff5f8);
        }
        if (local_658 == 2) {
          copy_to_image<unsigned_short>
                    (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,
                     in_stack_fffffffffffff5f8);
        }
        if (local_658 == 4) {
          copy_to_image<float>
                    (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,
                     in_stack_fffffffffffff5f8);
        }
      }
      if (local_64c == 3) {
        for (local_70c = 0; local_70c < local_630->c; local_70c = local_70c + 1) {
          local_4e8 = &local_758;
          local_c4 = local_630->w;
          local_c8 = local_630->h;
          local_cc = local_630->d;
          local_d8 = (void *)((long)local_630->data +
                             local_630->cstep * (long)local_70c * local_630->elemsize);
          local_e0 = local_630->elemsize;
          local_e4 = local_630->elempack;
          local_f0 = local_630->allocator;
          local_c0 = &local_758;
          local_750 = (int *)0x0;
          local_724 = 1;
          local_b0 = (long)local_c4 * (long)local_c8 * local_e0;
          local_718 = (local_b0 + 0xfU & 0xfffffffffffffff0) / local_e0;
          local_730 = local_630->dims + -1;
          if (local_630->dims == 4) {
            local_718 = (long)local_630->w * (long)local_630->h;
          }
          local_4b4 = local_70c + local_6bc;
          local_4a8 = &local_7a0;
          local_154 = local_638->w;
          local_158 = local_638->h;
          local_15c = local_638->d;
          local_168 = (void *)((long)local_638->data +
                              local_638->cstep * (long)local_4b4 * local_638->elemsize);
          local_170 = local_638->elemsize;
          local_174 = local_638->elempack;
          local_180 = local_638->allocator;
          local_150 = &local_7a0;
          local_798 = (int *)0x0;
          local_76c = 1;
          local_140 = (long)local_154 * (long)local_158 * local_170;
          local_760 = (local_140 + 0xfU & 0xfffffffffffffff0) / local_170;
          local_778 = local_638->dims + -1;
          if (local_638->dims == 4) {
            local_760 = (long)local_638->w * (long)local_638->h;
          }
          local_b4 = 0x10;
          local_144 = 0x10;
          local_4b0 = local_638;
          local_4b5 = 1;
          local_4f0 = local_630;
          local_4f4 = local_70c;
          local_4f5 = 1;
          local_7a0 = local_168;
          local_790 = local_170;
          local_788 = local_174;
          local_780 = local_180;
          local_774 = local_154;
          local_770 = local_158;
          local_768 = local_15c;
          local_758 = local_d8;
          local_748 = local_e0;
          local_740 = local_e4;
          local_738 = local_f0;
          local_72c = local_c4;
          local_728 = local_c8;
          local_720 = local_cc;
          if (local_658 == 1) {
            copy_to_image<signed_char>
                      (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5fc
                       ,in_stack_fffffffffffff5f8);
          }
          if (local_658 == 2) {
            copy_to_image<unsigned_short>
                      (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5fc
                       ,in_stack_fffffffffffff5f8);
          }
          if (local_658 == 4) {
            copy_to_image<float>
                      (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5fc
                       ,in_stack_fffffffffffff5f8);
          }
          local_5d8 = &local_7a0;
          local_350 = local_5d8;
          if (local_798 != (int *)0x0) {
            local_354 = 0xffffffff;
            LOCK();
            local_358 = *local_798;
            *local_798 = *local_798 + -1;
            UNLOCK();
            if (local_358 == 1) {
              if (local_780 == (Allocator *)0x0) {
                local_2e8 = local_7a0;
                if (local_7a0 != (void *)0x0) {
                  free(local_7a0);
                }
              }
              else {
                (*local_780->_vptr_Allocator[3])(local_780,local_7a0);
              }
            }
          }
          local_7a0 = (void *)0x0;
          local_790 = 0;
          local_788 = 0;
          local_778 = 0;
          local_774 = 0;
          local_770 = 0;
          local_76c = 0;
          local_768 = 0;
          local_760 = 0;
          local_798 = (int *)0x0;
          local_5c8 = &local_758;
          local_370 = local_5c8;
          if (local_750 != (int *)0x0) {
            local_374 = 0xffffffff;
            LOCK();
            local_378 = *local_750;
            *local_750 = *local_750 + -1;
            UNLOCK();
            if (local_378 == 1) {
              if (local_738 == (Allocator *)0x0) {
                local_2d8 = local_758;
                if (local_758 != (void *)0x0) {
                  free(local_758);
                }
              }
              else {
                (*local_738->_vptr_Allocator[3])(local_738,local_758);
              }
            }
          }
          local_758 = (void *)0x0;
          local_748 = 0;
          local_740 = 0;
          local_730 = 0;
          local_72c = 0;
          local_728 = 0;
          local_724 = 0;
          local_720 = 0;
          local_718 = 0;
          local_750 = (int *)0x0;
        }
      }
      if (local_64c == 4) {
        for (local_7a4 = 0; local_7a4 < local_630->c; local_7a4 = local_7a4 + 1) {
          for (local_7a8 = 0; local_7a8 < local_630->d; local_7a8 = local_7a8 + 1) {
            local_508 = &local_838;
            local_7c = local_630->w;
            local_80 = local_630->h;
            local_84 = local_630->d;
            local_90 = (void *)((long)local_630->data +
                               local_630->cstep * (long)local_7a4 * local_630->elemsize);
            local_98 = local_630->elemsize;
            local_9c = local_630->elempack;
            local_a8 = local_630->allocator;
            local_78 = &local_838;
            local_68 = (long)local_7c * (long)local_80 * local_98;
            local_488 = &local_7f0;
            local_490 = &local_838;
            local_18 = (void *)((long)local_90 +
                               (long)local_7c * (long)local_80 * (long)local_7a8 * local_98);
            local_8 = &local_7f0;
            local_7b0 = (long)local_7c * (long)local_80;
            local_5b8 = &local_838;
            local_4d4 = local_7a4 + local_6bc;
            local_4c8 = &local_8c8;
            local_10c = local_638->w;
            local_110 = local_638->h;
            local_114 = local_638->d;
            local_120 = (void *)((long)local_638->data +
                                local_638->cstep * (long)local_4d4 * local_638->elemsize);
            local_128 = local_638->elemsize;
            local_12c = local_638->elempack;
            local_138 = local_638->allocator;
            local_108 = &local_8c8;
            local_f8 = (long)local_10c * (long)local_110 * local_128;
            local_47c = local_7a8 + local_6b8;
            local_470 = &local_880;
            src = &local_8c8;
            local_48 = (void *)((long)local_120 +
                               (long)local_10c * (long)local_110 * (long)local_47c * local_128);
            local_38 = &local_880;
            local_840 = (long)local_10c * (long)local_110;
            self = &local_8c8;
            local_7b8 = 1;
            local_7bc = 1;
            local_7c8 = 2;
            local_7e8 = (int *)0x0;
            local_800 = 0;
            local_804 = 0;
            local_808 = 0;
            local_80c = 0;
            local_820 = 0;
            local_828 = 0;
            local_830 = 0;
            local_838 = 0;
            local_848 = 1;
            local_84c = 1;
            local_858 = 2;
            local_878 = (int *)0x0;
            local_6c = 0x10;
            local_fc = 0x10;
            local_494 = local_7a8;
            local_4d0 = local_638;
            local_4d5 = 1;
            local_510 = local_630;
            local_514 = local_7a4;
            local_515 = 1;
            local_7f8 = 0;
            local_810 = 0;
            local_8c8.data = (void *)0x0;
            local_8c8.elemsize = 0;
            local_8c8.elempack = 0;
            local_8c8.dims = 0;
            local_8c8.w = 0;
            local_8c8.h = 0;
            local_8c8.d = 0;
            local_8c8.c = 0;
            local_8c8.cstep = 0;
            local_8c8.refcount = (int *)0x0;
            local_5a8 = self;
            local_478 = src;
            local_3b0 = self;
            local_390 = local_5b8;
            local_60 = local_138;
            local_54 = local_12c;
            local_50 = local_128;
            local_40 = local_110;
            local_3c = local_10c;
            local_30 = local_a8;
            local_24 = local_9c;
            local_20 = local_98;
            local_10 = local_80;
            local_c = local_7c;
            local_8c8.allocator = local_138;
            local_880 = local_48;
            local_870 = local_128;
            local_868 = local_12c;
            local_860 = local_138;
            local_854 = local_10c;
            local_850 = local_110;
            local_818 = local_a8;
            local_7f0 = local_18;
            local_7e0 = local_98;
            local_7d8 = local_9c;
            local_7d0 = local_a8;
            local_7c4 = local_7c;
            local_7c0 = local_80;
            if (local_658 == 1) {
              copy_to_image<signed_char>
                        (src,self,in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8);
            }
            if (local_658 == 2) {
              copy_to_image<unsigned_short>
                        (src,self,in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8);
            }
            if (local_658 == 4) {
              copy_to_image<float>(src,self,in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8);
            }
            ppvVar4 = &local_880;
            local_598 = ppvVar4;
            local_3d0 = ppvVar4;
            if (local_878 != (int *)0x0) {
              local_3d4 = 0xffffffff;
              LOCK();
              local_3d8 = *local_878;
              *local_878 = *local_878 + -1;
              UNLOCK();
              if (local_3d8 == 1) {
                if (local_860 == (Allocator *)0x0) {
                  local_2a8 = local_880;
                  if (local_880 != (void *)0x0) {
                    free(local_880);
                  }
                }
                else {
                  (*local_860->_vptr_Allocator[3])(local_860,local_880);
                }
              }
            }
            *ppvVar4 = (void *)0x0;
            ppvVar4[2] = (void *)0x0;
            *(undefined4 *)(ppvVar4 + 3) = 0;
            *(undefined4 *)(ppvVar4 + 5) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
            *(undefined4 *)(ppvVar4 + 6) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
            *(undefined4 *)(ppvVar4 + 7) = 0;
            ppvVar4[8] = (void *)0x0;
            ppvVar4[1] = (void *)0x0;
            ppvVar4 = &local_7f0;
            local_588 = ppvVar4;
            local_3f0 = ppvVar4;
            if (local_7e8 != (int *)0x0) {
              local_3f4 = 0xffffffff;
              LOCK();
              local_3f8 = *local_7e8;
              *local_7e8 = *local_7e8 + -1;
              UNLOCK();
              if (local_3f8 == 1) {
                if (local_7d0 == (Allocator *)0x0) {
                  local_298 = local_7f0;
                  if (local_7f0 != (void *)0x0) {
                    free(local_7f0);
                  }
                }
                else {
                  (*local_7d0->_vptr_Allocator[3])(local_7d0,local_7f0);
                }
              }
            }
            *ppvVar4 = (void *)0x0;
            ppvVar4[2] = (void *)0x0;
            *(undefined4 *)(ppvVar4 + 3) = 0;
            *(undefined4 *)(ppvVar4 + 5) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
            *(undefined4 *)(ppvVar4 + 6) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
            *(undefined4 *)(ppvVar4 + 7) = 0;
            ppvVar4[8] = (void *)0x0;
            ppvVar4[1] = (void *)0x0;
          }
        }
      }
      local_5fc = 0;
    }
  }
  return local_5fc;
}

Assistant:

int CopyTo::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& self_blob = bottom_blobs[0];
    const Mat& src_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = self_blob.w;
    int h = self_blob.h;
    int d = self_blob.d;
    int channels = self_blob.c;
    int dims = self_blob.dims;
    size_t elemsize = self_blob.elemsize;

    if (src_blob.dims == dims && src_blob.w == w && src_blob.h == h && src_blob.d == d && src_blob.c == channels)
    {
        top_blob = src_blob;
        return 0;
    }

    top_blob = self_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int _woffset, _hoffset, _doffset, _coffset;
    resolve_copyto_offset(self_blob.shape(), _woffset, _hoffset, _doffset, _coffset);

    if (dims == 1)
    {
        if (elemsize == 1)
            copy_to_image<signed char>(src_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_to_image<unsigned short>(src_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_to_image<float>(src_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (elemsize == 1)
            copy_to_image<signed char>(src_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_to_image<unsigned short>(src_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_to_image<float>(src_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < src_blob.c; q++)
        {
            const Mat roim = src_blob.channel(q);
            Mat m = top_blob.channel(q + _coffset);

            if (elemsize == 1)
                copy_to_image<signed char>(roim, m, _hoffset, _woffset);
            if (elemsize == 2)
                copy_to_image<unsigned short>(roim, m, _hoffset, _woffset);
            if (elemsize == 4)
                copy_to_image<float>(roim, m, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < src_blob.c; q++)
        {
            for (int z = 0; z < src_blob.d; z++)
            {
                const Mat roim = src_blob.channel(q).depth(z);
                Mat m = top_blob.channel(q + _coffset).depth(z + _doffset);

                if (elemsize == 1)
                    copy_to_image<signed char>(roim, m, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_to_image<unsigned short>(roim, m, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_to_image<float>(roim, m, _hoffset, _woffset);
            }
        }
    }

    return 0;
}